

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

unique_function_record __thiscall pybind11::cpp_function::make_function_record(cpp_function *this)

{
  ushort *puVar1;
  PyObject *pPVar2;
  
  pPVar2 = (PyObject *)operator_new(0x88);
  pPVar2->ob_refcnt = 0;
  pPVar2->ob_type = (PyTypeObject *)0x0;
  pPVar2[1].ob_refcnt = 0;
  pPVar2[1].ob_type = (PyTypeObject *)0x0;
  pPVar2[2].ob_refcnt = 0;
  pPVar2[2].ob_type = (PyTypeObject *)0x0;
  pPVar2[3].ob_refcnt = 0;
  pPVar2[3].ob_type = (PyTypeObject *)0x0;
  pPVar2[4].ob_refcnt = 0;
  pPVar2[4].ob_type = (PyTypeObject *)0x0;
  *(undefined8 *)((long)&pPVar2[4].ob_type + 1) = 0;
  *(undefined8 *)((long)&pPVar2[5].ob_refcnt + 1) = 0;
  puVar1 = (ushort *)((long)&pPVar2[5].ob_type + 1);
  *puVar1 = *puVar1 & 0xfe00;
  *(undefined4 *)((long)&pPVar2[5].ob_type + 6) = 0;
  pPVar2[6].ob_type = (PyTypeObject *)0x0;
  pPVar2[7].ob_refcnt = 0;
  pPVar2[7].ob_type = (PyTypeObject *)0x0;
  pPVar2[8].ob_refcnt = 0;
  (this->super_function).super_object.super_handle.m_ptr = pPVar2;
  return (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
          )(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
            )this;
}

Assistant:

make_function_record() {
        return unique_function_record(new detail::function_record());
    }